

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

int8_t msocket_connect(msocket_t *self,char *addr,uint16_t port)

{
  int8_t iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  socklen_t __len;
  int iVar5;
  int sockoptval;
  undefined4 local_4c;
  sockaddr local_48;
  undefined4 uStack_38;
  undefined8 uStack_34;
  
  if ((addr == (char *)0x0 || self == (msocket_t *)0x0) || ((self->socketMode & 2) != 0)) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return -1;
  }
  local_4c = 1;
  if (self->handlerTable == (msocket_handler_t *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0xe;
    return -1;
  }
  if (self->addressFamily == '\n') {
    uStack_38 = 0;
    uStack_34 = 0;
    local_48.sa_family = 0;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    iVar2 = inet_pton(10,addr,local_48.sa_data + 6);
    iVar5 = -1;
    if (iVar2 < 1) goto LAB_0013e7ff;
    (self->tcpInfo).port = port;
    strcpy((self->tcpInfo).addr,addr);
    local_48.sa_data._0_2_ = port << 8 | port >> 8;
    local_48.sa_family = 10;
    iVar2 = socket(10,1,6);
    if (iVar2 < 0) goto LAB_0013e7ff;
    __len = 0x1c;
  }
  else {
    local_48.sa_family = 0;
    local_48.sa_data[0] = '\0';
    local_48.sa_data[1] = '\0';
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    iVar2 = inet_pton(2,addr,local_48.sa_data + 2);
    iVar5 = -1;
    if (iVar2 < 1) goto LAB_0013e7ff;
    strcpy((self->tcpInfo).addr,addr);
    local_48.sa_data._0_2_ = port << 8 | port >> 8;
    local_48.sa_family = 2;
    iVar2 = socket(2,1,6);
    if (iVar2 < 0) goto LAB_0013e7ff;
    __len = 0x10;
  }
  iVar5 = -1;
  iVar3 = connect(iVar2,&local_48,__len);
  if (iVar3 < 0) {
    close(iVar2);
  }
  else {
    (self->tcpInfo).port = port;
    self->tcpsockfd = iVar2;
    iVar5 = 0;
  }
LAB_0013e7ff:
  if (iVar5 < 0) {
    return -1;
  }
  setsockopt(self->tcpsockfd,6,1,&local_4c,4);
  self->socketMode = self->socketMode | 2;
  self->state = '\x04';
  self->newConnection = '\x01';
  iVar1 = msocket_startIoThread(self);
  if (iVar1 < '\0') {
    close(self->tcpsockfd);
    self->state = '\x06';
    return -1;
  }
  return '\0';
}

Assistant:

int8_t msocket_connect(msocket_t *self, const char *addr, uint16_t port){
   if( (self != 0) && (addr != 0) && ( (self->socketMode & MSOCKET_MODE_TCP) == 0) ) {
      int sockoptval = 1;
      socklen_t sockoptlen = sizeof(sockoptval);
      int result;
      if (self->handlerTable == 0) {
         errno = EFAULT;
         return -1;
      }
      result = (self->addressFamily == AF_INET6) ? msocket_connect_inet6(self, addr, port) : msocket_connect_inet(self, addr, port);
      if (result < 0) {
         return -1;
      }
      setsockopt(self->tcpsockfd, IPPROTO_TCP, TCP_NODELAY, (const char*)&sockoptval, sockoptlen);
      self->socketMode |= MSOCKET_MODE_TCP;
      self->state = MSOCKET_STATE_ESTABLISHED;
      self->newConnection = 1;
      result = msocket_startIoThread(self);
      if (result < 0) {
         SOCKET_CLOSE(self->tcpsockfd);
         self->state = MSOCKET_STATE_CLOSED;
         return -1;
      }
      return 0;
   }
   errno = EINVAL;
   return -1;
}